

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

type * __thiscall
linalg::detail::apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double>::impl<0,1,2,3>
          (undefined8 param_1,type *__return_storage_ptr__,
          apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar8._8_8_ = param_1;
  auVar8._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])this,auVar8);
  (__return_storage_ptr__->x).x = (double)auVar8._0_8_;
  (__return_storage_ptr__->x).y = (double)auVar8._8_8_;
  auVar1._8_8_ = param_1;
  auVar1._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x10),auVar1);
  (__return_storage_ptr__->x).z = (double)auVar8._0_8_;
  (__return_storage_ptr__->x).w = (double)auVar8._8_8_;
  auVar2._8_8_ = param_1;
  auVar2._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x20),auVar2);
  (__return_storage_ptr__->y).x = (double)auVar8._0_8_;
  (__return_storage_ptr__->y).y = (double)auVar8._8_8_;
  auVar3._8_8_ = param_1;
  auVar3._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x30),auVar3);
  (__return_storage_ptr__->y).z = (double)auVar8._0_8_;
  (__return_storage_ptr__->y).w = (double)auVar8._8_8_;
  auVar4._8_8_ = param_1;
  auVar4._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x40),auVar4);
  (__return_storage_ptr__->z).x = (double)auVar8._0_8_;
  (__return_storage_ptr__->z).y = (double)auVar8._8_8_;
  auVar5._8_8_ = param_1;
  auVar5._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x50),auVar5);
  (__return_storage_ptr__->z).z = (double)auVar8._0_8_;
  (__return_storage_ptr__->z).w = (double)auVar8._8_8_;
  auVar6._8_8_ = param_1;
  auVar6._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x60),auVar6);
  (__return_storage_ptr__->w).x = (double)auVar8._0_8_;
  (__return_storage_ptr__->w).y = (double)auVar8._8_8_;
  auVar7._8_8_ = param_1;
  auVar7._0_8_ = param_1;
  auVar8 = divpd(*(undefined1 (*) [16])(this + 0x70),auVar7);
  (__return_storage_ptr__->w).z = (double)auVar8._0_8_;
  (__return_storage_ptr__->w).w = (double)auVar8._8_8_;
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<J...>, F f, const mat<A,M,N> & a, const mat<B,M,N> & b) { return {apply<F, void, vec<A,M>, vec<B,M>>::impl(make_seq<0,M>{}, f, getter<J>{}(a), getter<J>{}(b))...}; }